

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpa.c
# Opt level: O1

_Bool duckdb_je_hpa_shard_init
                (hpa_shard_t *shard,hpa_central_t *central,emap_t *emap,base_t *base,
                edata_cache_t *edata_cache,uint ind,hpa_shard_opts_t *opts)

{
  size_t sVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  fxp_t fVar4;
  undefined3 uVar5;
  _Bool _Var6;
  undefined7 uVar7;
  _Bool _Var8;
  _Bool _Var9;
  
  _Var8 = duckdb_je_malloc_mutex_init
                    (&shard->grow_mtx,"hpa_shard_grow",WITNESS_RANK_EXTENT_GROW,
                     malloc_mutex_rank_exclusive);
  _Var9 = true;
  if (!_Var8) {
    _Var8 = duckdb_je_malloc_mutex_init
                      (&shard->mtx,"hpa_shard",WITNESS_RANK_EXTENTS,malloc_mutex_rank_exclusive);
    if (!_Var8) {
      shard->central = central;
      shard->base = base;
      duckdb_je_edata_cache_fast_init(&shard->ecf,edata_cache);
      duckdb_je_psset_init(&shard->psset);
      _Var9 = false;
      shard->age_counter = 0;
      shard->ind = ind;
      shard->emap = emap;
      sVar1 = opts->hugification_threshold;
      fVar4 = opts->dirty_mult;
      _Var8 = opts->deferral_allowed;
      uVar5 = *(undefined3 *)&opts->field_0x15;
      uVar2 = opts->hugify_delay_ms;
      uVar3 = opts->min_purge_interval_ms;
      _Var6 = opts->strict_min_purge_interval;
      uVar7 = *(undefined7 *)&opts->field_0x29;
      (shard->opts).slab_max_alloc = opts->slab_max_alloc;
      (shard->opts).hugification_threshold = sVar1;
      (shard->opts).dirty_mult = fVar4;
      (shard->opts).deferral_allowed = _Var8;
      *(undefined3 *)&(shard->opts).field_0x15 = uVar5;
      (shard->opts).hugify_delay_ms = uVar2;
      (shard->opts).min_purge_interval_ms = uVar3;
      (shard->opts).strict_min_purge_interval = _Var6;
      *(undefined7 *)&(shard->opts).field_0x29 = uVar7;
      shard->npending_purge = 0;
      duckdb_je_nstime_copy(&shard->last_purge,&nstime_zero);
      (shard->stats).nhugifies = 0;
      (shard->stats).ndehugifies = 0;
      (shard->stats).npurge_passes = 0;
      (shard->stats).npurges = 0;
      (shard->pai).alloc = hpa_alloc;
      (shard->pai).alloc_batch = hpa_alloc_batch;
      (shard->pai).expand = hpa_expand;
      (shard->pai).shrink = hpa_shrink;
      (shard->pai).dalloc = hpa_dalloc;
      (shard->pai).dalloc_batch = hpa_dalloc_batch;
      (shard->pai).time_until_deferred_work = hpa_time_until_deferred_work;
    }
  }
  return _Var9;
}

Assistant:

bool
hpa_shard_init(hpa_shard_t *shard, hpa_central_t *central, emap_t *emap,
    base_t *base, edata_cache_t *edata_cache, unsigned ind,
    const hpa_shard_opts_t *opts) {
	/* malloc_conf processing should have filtered out these cases. */
	assert(hpa_supported());
	bool err;
	err = malloc_mutex_init(&shard->grow_mtx, "hpa_shard_grow",
	    WITNESS_RANK_HPA_SHARD_GROW, malloc_mutex_rank_exclusive);
	if (err) {
		return true;
	}
	err = malloc_mutex_init(&shard->mtx, "hpa_shard",
	    WITNESS_RANK_HPA_SHARD, malloc_mutex_rank_exclusive);
	if (err) {
		return true;
	}

	assert(edata_cache != NULL);
	shard->central = central;
	shard->base = base;
	edata_cache_fast_init(&shard->ecf, edata_cache);
	psset_init(&shard->psset);
	shard->age_counter = 0;
	shard->ind = ind;
	shard->emap = emap;

	shard->opts = *opts;

	shard->npending_purge = 0;
	nstime_init_zero(&shard->last_purge);

	shard->stats.npurge_passes = 0;
	shard->stats.npurges = 0;
	shard->stats.nhugifies = 0;
	shard->stats.ndehugifies = 0;

	/*
	 * Fill these in last, so that if an hpa_shard gets used despite
	 * initialization failing, we'll at least crash instead of just
	 * operating on corrupted data.
	 */
	shard->pai.alloc = &hpa_alloc;
	shard->pai.alloc_batch = &hpa_alloc_batch;
	shard->pai.expand = &hpa_expand;
	shard->pai.shrink = &hpa_shrink;
	shard->pai.dalloc = &hpa_dalloc;
	shard->pai.dalloc_batch = &hpa_dalloc_batch;
	shard->pai.time_until_deferred_work = &hpa_time_until_deferred_work;

	hpa_do_consistency_checks(shard);

	return false;
}